

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
* OpenMD::operator&&(ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *cons1,
                    ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *cons2)

{
  AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
  *in_RDI;
  LessThanOrEqualToConstraint<double> *in_stack_000001b0;
  GreaterThanConstraint<double> *in_stack_000001b8;
  AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
  *in_stack_000001c0;
  AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
  *this;
  
  this = in_RDI;
  GreaterThanConstraint<double>::GreaterThanConstraint
            ((GreaterThanConstraint<double> *)in_RDI,(GreaterThanConstraint<double> *)in_RDI);
  LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
            ((LessThanOrEqualToConstraint<double> *)this,
             (LessThanOrEqualToConstraint<double> *)in_RDI);
  AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
  ::AndParamConstraint(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
  LessThanOrEqualToConstraint<double>::~LessThanOrEqualToConstraint
            ((LessThanOrEqualToConstraint<double> *)0x241c64);
  GreaterThanConstraint<double>::~GreaterThanConstraint((GreaterThanConstraint<double> *)0x241c6e);
  return this;
}

Assistant:

inline AndParamConstraint<Cons1T, Cons2T> operator&&(
      const ParamConstraintFacade<Cons1T>& cons1,
      const ParamConstraintFacade<Cons2T>& cons2) {
    return AndParamConstraint<Cons1T, Cons2T>(
        *static_cast<const Cons1T*>(&cons1),
        *static_cast<const Cons2T*>(&cons2));
  }